

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

unsigned_long chaiscript::bootstrap::parse_string<unsigned_long>(string *i)

{
  _Ios_Openmode _Var1;
  unsigned_long local_1a0;
  unsigned_long t;
  stringstream ss;
  string *i_local;
  
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&t,(string *)i,_Var1);
  std::istream::operator>>((istream *)&t,&local_1a0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&t);
  return local_1a0;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }